

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O0

bool __thiscall ami_nvar_t::nvar_entry_body_t::_is_null_guid(nvar_entry_body_t *this)

{
  string local_30;
  nvar_entry_body_t *local_10;
  nvar_entry_body_t *this_local;
  
  local_10 = this;
  guid_abi_cxx11_(&local_30,this);
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)(this->n_guid & 1);
}

Assistant:

bool _is_null_guid() { guid(); return n_guid; }